

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zes_valddi.cpp
# Opt level: O1

ze_result_t
validation_layer::zesVFManagementSetVFTelemetryModeExp
          (zes_vf_handle_t hVFhandle,zes_vf_info_util_exp_flags_t flags,ze_bool_t enable)

{
  long lVar1;
  long lVar2;
  code *pcVar3;
  long lVar4;
  long *plVar5;
  ze_result_t zVar6;
  ze_result_t result;
  undefined7 in_register_00000011;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  bool bVar10;
  ze_result_t local_8c;
  long *local_68 [2];
  long local_58 [2];
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  
  lVar4 = context;
  uVar9 = CONCAT71(in_register_00000011,enable) & 0xffffffff;
  local_8c = (ze_result_t)CONCAT71(in_register_00000011,enable);
  lVar2 = *(long *)(context + 0xd50);
  local_68[0] = local_58;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_68,"zesVFManagementSetVFTelemetryModeExp(hVFhandle, flags, enable)","")
  ;
  if (*(char *)(lVar2 + 1) == '\x01') {
    local_48 = 0;
    uStack_40 = 0;
    local_38 = 0;
    spdlog::logger::log(*(logger **)(lVar2 + 8),0.0);
  }
  if (local_68[0] != local_58) {
    operator_delete(local_68[0],local_58[0] + 1);
  }
  pcVar3 = *(code **)(lVar4 + 0xd00);
  if (pcVar3 == (code *)0x0) {
    zVar6 = ZE_RESULT_ERROR_UNSUPPORTED_FEATURE;
  }
  else {
    lVar2 = *(long *)(lVar4 + 0xd30);
    lVar4 = *(long *)(lVar4 + 0xd38);
    uVar7 = lVar4 - lVar2 >> 3;
    bVar10 = lVar4 != lVar2;
    if (bVar10) {
      uVar8 = 1;
      do {
        plVar5 = *(long **)(*(long *)(*(long *)(context + 0xd30) + -8 + uVar8 * 8) + 8);
        zVar6 = (**(code **)(*plVar5 + 0x8e0))(plVar5,hVFhandle,flags,enable);
        if (zVar6 != ZE_RESULT_SUCCESS) {
          logAndPropagateResult("zesVFManagementSetVFTelemetryModeExp",zVar6);
          uVar9 = (ulong)zVar6;
        }
        local_8c = (ze_result_t)uVar9;
        if (zVar6 != ZE_RESULT_SUCCESS) break;
        bVar10 = uVar8 < uVar7;
        lVar1 = (-(ulong)(uVar7 == 0) - uVar7) + uVar8;
        uVar8 = uVar8 + 1;
      } while (lVar1 != 0);
    }
    if (bVar10) {
      return local_8c;
    }
    if ((*(char *)(context + 4) == '\x01') &&
       (zVar6 = ZESHandleLifetimeValidation::zesVFManagementSetVFTelemetryModeExpPrologue
                          ((ZESHandleLifetimeValidation *)(*(long *)(context + 0xd48) + 8),hVFhandle
                           ,flags,enable), zVar6 != ZE_RESULT_SUCCESS)) {
      logAndPropagateResult("zesVFManagementSetVFTelemetryModeExp",zVar6);
      return zVar6;
    }
    zVar6 = (*pcVar3)(hVFhandle,flags,enable);
    bVar10 = lVar4 != lVar2;
    if (bVar10) {
      uVar9 = 1;
      do {
        plVar5 = *(long **)(*(long *)(*(long *)(context + 0xd30) + -8 + uVar9 * 8) + 8);
        result = (**(code **)(*plVar5 + 0x8e8))(plVar5,hVFhandle,flags,enable,zVar6);
        if (result != ZE_RESULT_SUCCESS) {
          logAndPropagateResult("zesVFManagementSetVFTelemetryModeExp",result);
          local_8c = result;
          break;
        }
        bVar10 = uVar9 < uVar7;
        lVar2 = uVar9 + (-(ulong)(uVar7 == 0) - uVar7);
        uVar9 = uVar9 + 1;
      } while (lVar2 != 0);
    }
    if (bVar10) {
      return local_8c;
    }
  }
  logAndPropagateResult("zesVFManagementSetVFTelemetryModeExp",zVar6);
  return zVar6;
}

Assistant:

__zedlllocal ze_result_t ZE_APICALL
    zesVFManagementSetVFTelemetryModeExp(
        zes_vf_handle_t hVFhandle,                      ///< [in] Sysman handle for the component.
        zes_vf_info_util_exp_flags_t flags,             ///< [in] utilization flags to enable or disable. May be 0 or a valid
                                                        ///< combination of ::zes_vf_info_util_exp_flag_t.
        ze_bool_t enable                                ///< [in] Enable utilization telemetry.
        )
    {
        context.logger->log_trace("zesVFManagementSetVFTelemetryModeExp(hVFhandle, flags, enable)");

        auto pfnSetVFTelemetryModeExp = context.zesDdiTable.VFManagementExp.pfnSetVFTelemetryModeExp;

        if( nullptr == pfnSetVFTelemetryModeExp )
            return logAndPropagateResult("zesVFManagementSetVFTelemetryModeExp", ZE_RESULT_ERROR_UNSUPPORTED_FEATURE);

        auto numValHandlers = context.validationHandlers.size();
        for (size_t i = 0; i < numValHandlers; i++) {
            auto result = context.validationHandlers[i]->zesValidation->zesVFManagementSetVFTelemetryModeExpPrologue( hVFhandle, flags, enable );
            if(result!=ZE_RESULT_SUCCESS) return logAndPropagateResult("zesVFManagementSetVFTelemetryModeExp", result);
        }


        if( context.enableThreadingValidation ){ 
            //Unimplemented
        }

        
        if(context.enableHandleLifetime ){
            auto result = context.handleLifetime->zesHandleLifetime.zesVFManagementSetVFTelemetryModeExpPrologue( hVFhandle, flags, enable );
            if(result!=ZE_RESULT_SUCCESS) return logAndPropagateResult("zesVFManagementSetVFTelemetryModeExp", result);
        }

        auto driver_result = pfnSetVFTelemetryModeExp( hVFhandle, flags, enable );

        for (size_t i = 0; i < numValHandlers; i++) {
            auto result = context.validationHandlers[i]->zesValidation->zesVFManagementSetVFTelemetryModeExpEpilogue( hVFhandle, flags, enable ,driver_result);
            if(result!=ZE_RESULT_SUCCESS) return logAndPropagateResult("zesVFManagementSetVFTelemetryModeExp", result);
        }

        return logAndPropagateResult("zesVFManagementSetVFTelemetryModeExp", driver_result);
    }